

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O0

double __thiscall HPreData::getaij(HPreData *this,int i,int j)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int k;
  int local_14;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x150),(long)in_ESI);
  local_14 = *pvVar2;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)local_14);
    bVar1 = false;
    if (in_EDX != *pvVar2) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x150),(long)(in_ESI + 1));
      bVar1 = local_14 <= *pvVar2;
    }
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x150),(long)(in_ESI + 1));
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),(long)local_14);
  return *pvVar3;
}

Assistant:

double HPreData::getaij(int i, int j) {
	int k=ARstart[i];
    while (j != ARindex[k] && k<=ARstart[i+1])
            k++;
    if (k==ARstart[i+1]) {
    	//cout<<"Error: No such element in A: row "<<i<<", column "<<j<<endl;
    	//exit(0);
    	}
    return ARvalue[k];
}